

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PushPopTest.cpp
# Opt level: O3

void __thiscall
PushPopTest_TimeMeasurement_Test::~PushPopTest_TimeMeasurement_Test
          (PushPopTest_TimeMeasurement_Test *this)

{
  Test *this_00;
  
  this_00 = (Test *)&this[-1].super_PushPopTest.stdDeque.
                     super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
                     _M_finish._M_last;
  this[-1].super_PushPopTest.stdDeque.super__Deque_base<int,_std::allocator<int>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)&PTR__PushPopTest_00162cf8;
  (this->super_PushPopTest).super_TestWithParam<unsigned_long>.super_Test._vptr_Test =
       (_func_int **)&DAT_00162d38;
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            ((_Deque_base<int,_std::allocator<int>_> *)
             &(this->super_PushPopTest).myDeque.big_.allocSize_);
  Deque<int,_std::allocator<int>_>::~Deque
            ((Deque<int,_std::allocator<int>_> *)&(this->super_PushPopTest)._A);
  testing::Test::~Test(this_00);
  operator_delete(this_00);
  return;
}

Assistant:

TEST_P(PushPopTest, TimeMeasurement) {
    std::size_t n = GetParam();

    resetRandom();
    MEASURE_TIME_BEGIN(stdDequeMs);
    for (std::size_t i = 0; i < n; ++i) {
        int x = nextRandom();
        stdDeque.push_back(x);
        int y = nextRandom();
        stdDeque.push_front(y);
    }

    while (!stdDeque.empty()) {
        stdDeque.pop_back();
    }
    MEASURE_TIME_END(stdDequeMs);

    resetRandom();
    MEASURE_TIME_BEGIN(myDequeMs);
    for (std::size_t i = 0; i < n; ++i) {
        int x = nextRandom();
        myDeque.push_back(x);
        int y = nextRandom();
        myDeque.push_front(y);
    }

    while (!myDeque.empty()) {
        myDeque.pop_back();
    }
    MEASURE_TIME_END(myDequeMs);

    std::cout   << "std::deque time: " << stdDequeMs << " ms." << std::endl
                << "My Deque time: " << myDequeMs << " ms." << std::endl;
}